

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_extra.cc
# Opt level: O3

int marshal_digest_algorithm(CBB *cbb,EVP_MD *md,bool with_null)

{
  int iVar1;
  long lVar2;
  CBB algorithm;
  CBB oid;
  CBB null;
  CBB local_b0;
  CBB local_80;
  CBB local_50;
  
  iVar1 = CBB_add_asn1(cbb,&local_b0,0x20000010);
  if ((iVar1 != 0) && (iVar1 = CBB_add_asn1(&local_b0,&local_80,6), iVar1 != 0)) {
    iVar1 = EVP_MD_type((EVP_MD *)md);
    lVar2 = 0;
    do {
      if (iVar1 == *(int *)(kMDOIDs[0].oid + lVar2 + 0xc)) {
        iVar1 = CBB_add_bytes(&local_80,kMDOIDs[0].oid + lVar2,(ulong)kMDOIDs[0].oid[lVar2 + 9]);
        if (iVar1 == 0) {
          return 0;
        }
        if ((with_null) && (iVar1 = CBB_add_asn1(&local_b0,&local_50,5), iVar1 == 0)) {
          return 0;
        }
        iVar1 = CBB_flush(cbb);
        return (uint)(iVar1 != 0);
      }
      lVar2 = lVar2 + 0x10;
    } while (lVar2 != 0x70);
    ERR_put_error(0x1d,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/digest/digest_extra.cc"
                  ,0xb4);
  }
  return 0;
}

Assistant:

static int marshal_digest_algorithm(CBB *cbb, const EVP_MD *md,
                                    bool with_null) {
  CBB algorithm, oid, null;
  if (!CBB_add_asn1(cbb, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1(&algorithm, &oid, CBS_ASN1_OBJECT)) {
    return 0;
  }

  bool found = false;
  int nid = EVP_MD_type(md);
  for (const auto &mdoid : kMDOIDs) {
    if (nid == mdoid.nid) {
      if (!CBB_add_bytes(&oid, mdoid.oid, mdoid.oid_len)) {
        return 0;
      }
      found = true;
      break;
    }
  }

  if (!found) {
    OPENSSL_PUT_ERROR(DIGEST, DIGEST_R_UNKNOWN_HASH);
    return 0;
  }

  if ((with_null && !CBB_add_asn1(&algorithm, &null, CBS_ASN1_NULL)) ||  //
      !CBB_flush(cbb)) {
    return 0;
  }

  return 1;
}